

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrowHandler.cpp
# Opt level: O0

ArrowOpt __thiscall yb::ArrowHandler::handle(ArrowHandler *this,uchar c)

{
  bool bVar1;
  int iVar2;
  reference ppVar3;
  type *ptVar4;
  type *ptVar5;
  string *psVar6;
  long lVar7;
  long lVar8;
  char in_DL;
  undefined7 in_register_00000031;
  long lVar9;
  Arrow local_6c;
  int local_68;
  string local_58 [8];
  type ec;
  _Node_iterator_base<std::pair<const_yb::Arrow,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  _Stack_30;
  Arrow arrow;
  _Node_iterator_base<std::pair<const_yb::Arrow,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_28;
  iterator it;
  uchar c_local;
  ArrowHandler *this_local;
  
  lVar9 = CONCAT71(in_register_00000031,c);
  std::__cxx11::string::operator+=((string *)(lVar9 + 0x40),in_DL);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<yb::Arrow,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<yb::Arrow>,_std::equal_to<yb::Arrow>,_std::allocator<std::pair<const_yb::Arrow,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin((unordered_map<yb::Arrow,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<yb::Arrow>,_std::equal_to<yb::Arrow>,_std::allocator<std::pair<const_yb::Arrow,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(lVar9 + 8));
  while( true ) {
    _Stack_30._M_cur =
         (__node_type *)
         std::
         unordered_map<yb::Arrow,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<yb::Arrow>,_std::equal_to<yb::Arrow>,_std::allocator<std::pair<const_yb::Arrow,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((unordered_map<yb::Arrow,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<yb::Arrow>,_std::equal_to<yb::Arrow>,_std::allocator<std::pair<const_yb::Arrow,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(lVar9 + 8));
    bVar1 = std::__detail::operator!=(&local_28,&stack0xffffffffffffffd0);
    if (!bVar1) {
      std::__cxx11::string::clear();
      memset(this,0,8);
      std::experimental::fundamentals_v1::optional<yb::Arrow>::optional((optional<yb::Arrow> *)this)
      ;
      return (ArrowOpt)(_Optional_base<yb::Arrow,_false>)this;
    }
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_yb::Arrow,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ::operator*((_Node_iterator<std::pair<const_yb::Arrow,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                          *)&local_28);
    ptVar4 = std::get<0ul,yb::Arrow_const,std::__cxx11::string>(ppVar3);
    ec.field_2._12_4_ = *ptVar4;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_yb::Arrow,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ::operator*((_Node_iterator<std::pair<const_yb::Arrow,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                          *)&local_28);
    ptVar5 = std::get<1ul,yb::Arrow_const,std::__cxx11::string>(ppVar3);
    std::__cxx11::string::string(local_58,(string *)ptVar5);
    psVar6 = (string *)std::__cxx11::string::length();
    iVar2 = std::__cxx11::string::compare((ulong)local_58,0,psVar6);
    if (iVar2 == 0) {
      lVar7 = std::__cxx11::string::length();
      lVar8 = std::__cxx11::string::length();
      if (lVar7 == lVar8) {
        std::__cxx11::string::clear();
        std::experimental::fundamentals_v1::optional<yb::Arrow>::optional<yb::Arrow,_true>
                  ((optional<yb::Arrow> *)this,(Arrow *)(ec.field_2._M_local_buf + 0xc));
        local_68 = 1;
      }
      else {
        local_6c = invalid;
        std::experimental::fundamentals_v1::optional<yb::Arrow>::optional<yb::Arrow,_true>
                  ((optional<yb::Arrow> *)this,&local_6c);
        local_68 = 1;
      }
    }
    else {
      local_68 = 0;
    }
    std::__cxx11::string::~string(local_58);
    if (local_68 != 0) break;
    std::__detail::
    _Node_iterator<std::pair<const_yb::Arrow,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    ::operator++((_Node_iterator<std::pair<const_yb::Arrow,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                  *)&local_28);
  }
  return (ArrowOpt)(_Optional_base<yb::Arrow,_false>)this;
}

Assistant:

ArrowHandler::ArrowOpt ArrowHandler::handle(unsigned char c) {
    currentState_ += c;
    for (auto it = escapeCodes_.begin(); it != escapeCodes_.end(); ++it) {
        auto arrow = std::get<0>(*it);
        auto ec = std::get<1>(*it);
        if (ec.compare(0, currentState_.length(), currentState_) == 0) {
            if (ec.length() == currentState_.length()) {
                currentState_.clear();
                return arrow;
            }
            return Arrow::invalid;
        }
    }
    currentState_.clear();
    return {};
}